

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O2

int __thiscall UEFIFind::init(UEFIFind *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  USTATUS UVar2;
  UByteArray buffer;
  
  buffer.d._M_dataplus._M_p = (pointer)&buffer.d.field_2;
  buffer.d._M_string_length = 0;
  buffer.d.field_2._M_local_buf[0] = '\0';
  bVar1 = readFileIntoBuffer((CBString *)ctx,&buffer);
  if (bVar1) {
    UVar2 = FfsParser::parse(this->ffsParser,&buffer);
    if (UVar2 == 0) {
      this->initDone = true;
      UVar2 = 0;
    }
  }
  else {
    UVar2 = 5;
  }
  std::__cxx11::string::~string((string *)&buffer);
  return (int)UVar2;
}

Assistant:

USTATUS UEFIFind::init(const UString & path)
{
    UByteArray buffer;
    if (false == readFileIntoBuffer(path, buffer))
        return U_FILE_OPEN;

    USTATUS result = ffsParser->parse(buffer);
    if (result)
        return result;

    initDone = true;
    return U_SUCCESS;
}